

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O0

void t1_dec_sigpass_mqc(opj_t1_t *t1,int bpno,int orient)

{
  uint uVar1;
  uint orient_00;
  uint oneplushalf_00;
  undefined4 in_EDX;
  undefined4 in_ESI;
  long in_RDI;
  flag_t *flags2_1;
  int *data2_1;
  flag_t *flags2;
  int *data2;
  flag_t *flags1;
  int *data1;
  int oneplushalf;
  int half;
  int one;
  int k;
  int j;
  int i;
  int iVar2;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar3;
  int iVar4;
  
  uVar1 = 1 << ((byte)in_ESI & 0x1f);
  orient_00 = (int)uVar1 >> 1;
  oneplushalf_00 = uVar1 | orient_00;
  for (iVar2 = 0; iVar2 < (int)(*(uint *)(in_RDI + 0x2c) & 0xfffffffc); iVar2 = iVar2 + 4) {
    for (iVar4 = 0; iVar4 < *(int *)(in_RDI + 0x28); iVar4 = iVar4 + 1) {
      t1_dec_sigpass_step_mqc
                ((opj_t1_t *)CONCAT44(in_ESI,in_EDX),
                 (flag_t *)CONCAT44(iVar4,in_stack_ffffffffffffffe8),(int *)CONCAT44(iVar2,uVar1),
                 orient_00,oneplushalf_00);
      t1_dec_sigpass_step_mqc
                ((opj_t1_t *)CONCAT44(in_ESI,in_EDX),
                 (flag_t *)CONCAT44(iVar4,in_stack_ffffffffffffffe8),(int *)CONCAT44(iVar2,uVar1),
                 orient_00,oneplushalf_00);
      t1_dec_sigpass_step_mqc
                ((opj_t1_t *)CONCAT44(in_ESI,in_EDX),
                 (flag_t *)CONCAT44(iVar4,in_stack_ffffffffffffffe8),(int *)CONCAT44(iVar2,uVar1),
                 orient_00,oneplushalf_00);
      t1_dec_sigpass_step_mqc
                ((opj_t1_t *)CONCAT44(in_ESI,in_EDX),
                 (flag_t *)CONCAT44(iVar4,in_stack_ffffffffffffffe8),(int *)CONCAT44(iVar2,uVar1),
                 orient_00,oneplushalf_00);
    }
  }
  for (iVar4 = 0; iVar3 = iVar2, iVar4 < *(int *)(in_RDI + 0x28); iVar4 = iVar4 + 1) {
    for (; iVar3 < *(int *)(in_RDI + 0x2c); iVar3 = iVar3 + 1) {
      t1_dec_sigpass_step_mqc
                ((opj_t1_t *)CONCAT44(in_ESI,in_EDX),(flag_t *)CONCAT44(iVar4,iVar3),
                 (int *)CONCAT44(iVar2,uVar1),orient_00,oneplushalf_00);
    }
  }
  return;
}

Assistant:

static void t1_dec_sigpass_mqc(
		opj_t1_t *t1,
		int bpno,
		int orient)
{
	int i, j, k, one, half, oneplushalf;
	int *data1 = t1->data;
	flag_t *flags1 = &t1->flags[1];
	one = 1 << bpno;
	half = one >> 1;
	oneplushalf = one | half;
	for (k = 0; k < (t1->h & ~3); k += 4) {
		for (i = 0; i < t1->w; ++i) {
			int *data2 = data1 + i;
			flag_t *flags2 = flags1 + i;
			flags2 += t1->flags_stride;
			t1_dec_sigpass_step_mqc(t1, flags2, data2, orient, oneplushalf);
			data2 += t1->w;
			flags2 += t1->flags_stride;
			t1_dec_sigpass_step_mqc(t1, flags2, data2, orient, oneplushalf);
			data2 += t1->w;
			flags2 += t1->flags_stride;
			t1_dec_sigpass_step_mqc(t1, flags2, data2, orient, oneplushalf);
			data2 += t1->w;
			flags2 += t1->flags_stride;
			t1_dec_sigpass_step_mqc(t1, flags2, data2, orient, oneplushalf);
			data2 += t1->w;
		}
		data1 += t1->w << 2;
		flags1 += t1->flags_stride << 2;
	}
	for (i = 0; i < t1->w; ++i) {
		int *data2 = data1 + i;
		flag_t *flags2 = flags1 + i;
		for (j = k; j < t1->h; ++j) {
			flags2 += t1->flags_stride;
			t1_dec_sigpass_step_mqc(t1, flags2, data2, orient, oneplushalf);
			data2 += t1->w;
		}
	}
}